

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::PrintRawArrayTo<int>(int *a,size_t cnt,iu_ostream *os)

{
  ulong uVar1;
  int *value;
  
  printer_internal2::DefaultPrintNonContainerTo<int>(a,os);
  value = a + 1;
  for (uVar1 = 1; uVar1 < cnt; uVar1 = uVar1 + 1) {
    std::operator<<(os,", ");
    printer_internal2::DefaultPrintNonContainerTo<int>(value,os);
    value = value + 1;
  }
  return;
}

Assistant:

inline void PrintRawArrayTo(const T* a, size_t cnt, iu_ostream* os)
{
    UniversalPrint<T>(a[0], os);
    for( size_t i=1; i < cnt; ++i )
    {
        *os << ", ";
        UniversalPrint<T>(a[i], os);
    }
}